

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O1

void __thiscall
Reset_addResetInvalidArguments_Test::~Reset_addResetInvalidArguments_Test
          (Reset_addResetInvalidArguments_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, addResetInvalidArguments)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ(size_t(0), c->resetCount());

    // Add r to c.
    EXPECT_TRUE(c->addReset(r));
    EXPECT_EQ(size_t(1), c->resetCount());

    // Add r to c again.
    EXPECT_TRUE(c->addReset(r));
    EXPECT_EQ(size_t(2), c->resetCount());

    // Try to add a nullptr to c, which cannot be done.
    EXPECT_FALSE(c->addReset(nullptr));
    EXPECT_EQ(size_t(2), c->resetCount());
}